

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnMemoryCopyExpr
          (ExprVisitorDelegate *this,MemoryCopyExpr *expr)

{
  WatWriter *pWVar1;
  Index IVar2;
  Info local_68;
  
  pWVar1 = this->writer_;
  Opcode::GetInfo(&local_68,(Opcode *)&Opcode::MemoryCopy_Opcode);
  WritePuts(pWVar1,local_68.name,Space);
  pWVar1 = this->writer_;
  IVar2 = Module::GetMemoryIndex((pWVar1->super_ModuleContext).module,&expr->destmemidx);
  if (IVar2 == 0) {
    IVar2 = Module::GetMemoryIndex((pWVar1->super_ModuleContext).module,&expr->srcmemidx);
    if (IVar2 == 0) {
      pWVar1->next_char_ = Space;
      goto LAB_001965cf;
    }
  }
  WriteVar(pWVar1,&expr->destmemidx,Space);
  WriteVar(pWVar1,&expr->srcmemidx,Space);
LAB_001965cf:
  pWVar1 = this->writer_;
  if (pWVar1->next_char_ == ForceNewline) {
    WriteNextChar(pWVar1);
  }
  pWVar1->next_char_ = Newline;
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnMemoryCopyExpr(MemoryCopyExpr* expr) {
  writer_->WritePutsSpace(Opcode::MemoryCopy_Opcode.GetName());
  writer_->WriteTwoMemoryVarsUnlessBothZero(expr->destmemidx, expr->srcmemidx,
                                            NextChar::Space);
  writer_->WriteNewline(NO_FORCE_NEWLINE);
  return Result::Ok;
}